

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall rlottie::internal::renderer::SolidLayer::updateContent(SolidLayer *this)

{
  VPath *this_00;
  DirtyFlag *pDVar1;
  float fVar2;
  float fVar3;
  VSize VVar4;
  Extra *pEVar5;
  uint uVar6;
  VPathData *pVVar7;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int in_ESI;
  VRectF *rect;
  VBrush brush;
  VColor local_4c;
  undefined1 local_48 [12];
  float fStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  uVar6 = (this->super_Layer).mDirtyFlag.i;
  if ((uVar6 & 1) != 0) {
    this_00 = &this->mPath;
    pVVar7 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,in_ESI,in_RDX,in_RCX);
    VPath::VPathData::reset(pVVar7);
    VVar4 = ((this->super_Layer).mLayerData)->mLayerSize;
    rect = (VRectF *)local_48;
    local_48._0_4_ = 0.0;
    local_48._4_4_ = 0.0;
    fStack_3c = (float)VVar4.mh;
    local_48._8_4_ = (float)VVar4.mw;
    pVVar7 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,in_ESI,__buf,in_RCX);
    VPath::VPathData::addRect(pVVar7,rect,CW);
    local_28._0_4_ = (this->super_Layer).mCombinedMatrix.m33;
    local_28._4_1_ = (this->super_Layer).mCombinedMatrix.mType;
    local_28._5_1_ = (this->super_Layer).mCombinedMatrix.dirty;
    local_28._6_2_ = *(undefined2 *)&(this->super_Layer).mCombinedMatrix.field_0x26;
    local_48._0_4_ = (this->super_Layer).mCombinedMatrix.m11;
    local_48._4_4_ = (this->super_Layer).mCombinedMatrix.m12;
    unique0x1000014c =
         *(anon_union_8_3_adf75f03_for_VBrush_2 *)&(this->super_Layer).mCombinedMatrix.m13;
    local_38._0_4_ = (this->super_Layer).mCombinedMatrix.m22;
    local_38._4_4_ = (this->super_Layer).mCombinedMatrix.m23;
    uStack_30._0_4_ = (this->super_Layer).mCombinedMatrix.mtx;
    uStack_30._4_4_ = (this->super_Layer).mCombinedMatrix.mty;
    pVVar7 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,(int)rect,__buf_00,in_RCX);
    VPath::VPathData::transform(pVVar7,(VMatrix *)local_48);
    pDVar1 = &(this->mRenderNode).super_VDrawable.mFlag;
    *(byte *)&pDVar1->i = (byte)pDVar1->i | 2;
    vcow_ptr<VPath::VPathData>::operator=
              ((vcow_ptr<VPath::VPathData> *)&this->mRenderNode,&this_00->d);
    uVar6 = (this->super_Layer).mDirtyFlag.i;
  }
  if ((uVar6 & 2) != 0) {
    pEVar5 = (((this->super_Layer).mLayerData)->mExtra)._M_t.
             super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
             ._M_t.
             super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
             .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
    if (pEVar5 == (Extra *)0x0) {
      fVar2 = 1.0;
      fVar3 = 1.0;
      uVar6 = 0xff000000;
    }
    else {
      fVar2 = (pEVar5->mSolidColor).r;
      fVar3 = (pEVar5->mSolidColor).g;
      uVar6 = (int)((pEVar5->mSolidColor).b * 255.0) << 0x18;
    }
    local_4c = (VColor)((int)((this->super_Layer).mCombinedAlpha * 255.0) & 0xffU |
                       ((int)(fVar2 * 255.0) & 0xffU) << 8 | uVar6 |
                       ((int)(fVar3 * 255.0) & 0xffU) << 0x10);
    VBrush::VBrush((VBrush *)local_48,&local_4c);
    *(undefined8 *)&(this->mRenderNode).super_VDrawable.mBrush = local_48._0_8_;
    (this->mRenderNode).super_VDrawable.mBrush.field_1 = stack0xffffffffffffffc0;
    pDVar1 = &(this->mRenderNode).super_VDrawable.mFlag;
    *(byte *)&pDVar1->i = (byte)pDVar1->i | 8;
  }
  return;
}

Assistant:

void renderer::SolidLayer::updateContent()
{
    if (flag() & DirtyFlagBit::Matrix) {
        mPath.reset();
        mPath.addRect(VRectF(0, 0, mLayerData->layerSize().width(),
                            mLayerData->layerSize().height()));
        mPath.transform(combinedMatrix());
        mRenderNode.mFlag |= VDrawable::DirtyState::Path;
        mRenderNode.mPath = mPath;
    }
    if (flag() & DirtyFlagBit::Alpha) {
        model::Color color = mLayerData->solidColor();
        VBrush       brush(color.toColor(combinedAlpha()));
        mRenderNode.setBrush(brush);
        mRenderNode.mFlag |= VDrawable::DirtyState::Brush;
    }
}